

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

void eAX_Iv(PDISASM pMyDisasm)

{
  OPTYPE *pBuffer;
  UInt8 UVar1;
  int iVar2;
  char (*pacVar3) [8];
  char (*pacVar4) [4];
  char (*__src) [8];
  ulong uVar5;
  long lStack_20;
  
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  pBuffer = &pMyDisasm->Operand2;
  (pMyDisasm->Operand2).OpType = 0x8040000;
  iVar2 = (pMyDisasm->Reserved_).OperandSize;
  if (iVar2 == 0x20) {
    iVar2 = Security(5,pMyDisasm);
    if (iVar2 == 0) {
      return;
    }
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand2).OpSize = 0x20;
    uVar5 = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,pBuffer->OpMnemonic,"%.8X",uVar5);
    (pMyDisasm->Instruction).Immediat = uVar5;
    UVar1 = (pMyDisasm->Reserved_).REX.B_;
    pacVar3 = Registers32Bits + 8;
    pacVar4 = (char (*) [4])Registers32Bits;
  }
  else {
    if (iVar2 != 0x40) {
      iVar2 = Security(3,pMyDisasm);
      if (iVar2 == 0) {
        return;
      }
      (pMyDisasm->Reserved_).ImmediatSize = 0x10;
      (pMyDisasm->Operand1).OpSize = 0x10;
      (pMyDisasm->Operand2).OpSize = 0x10;
      uVar5 = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 1);
      CopyFormattedNumber(pMyDisasm,pBuffer->OpMnemonic,"%.8X",uVar5);
      (pMyDisasm->Instruction).Immediat = uVar5;
      __src = Registers16Bits;
      if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
        __src = Registers16Bits + 8;
      }
      lStack_20 = 3;
      goto LAB_0013294c;
    }
    iVar2 = Security(5,pMyDisasm);
    if (iVar2 == 0) {
      return;
    }
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    (pMyDisasm->Operand1).OpSize = 0x40;
    (pMyDisasm->Operand2).OpSize = 0x20;
    uVar5 = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,pBuffer->OpMnemonic,"%.16llX",uVar5);
    (pMyDisasm->Instruction).Immediat = uVar5;
    UVar1 = (pMyDisasm->Reserved_).REX.B_;
    pacVar3 = (char (*) [8])(Registers64Bits + 8);
    pacVar4 = Registers64Bits;
  }
  __src = (char (*) [8])pacVar4;
  if (UVar1 == '\x01') {
    __src = pacVar3;
  }
  lStack_20 = 5;
LAB_0013294c:
  strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + lStack_20;
  if ((pMyDisasm->Prefix).LockPrefix == '\x01') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  return;
}

Assistant:

void __bea_callspec__ eAX_Iv(PDISASM pMyDisasm)
{
    UInt32 MyNumber;
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
    pMyDisasm->Operand1.Registers.gpr = REG0;
    pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
    if (GV.OperandSize == 64) {
      if (!Security(5, pMyDisasm)) return;
      GV.ImmediatSize = 32;
      pMyDisasm->Operand1.OpSize = 64;
      pMyDisasm->Operand2.OpSize = 32;
      MyNumber = *((UInt32*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.16llX",(Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0+8]);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
          #endif
      }
      GV.EIP_+= 5;
    }
    else if (GV.OperandSize == 32) {
      if (!Security(5, pMyDisasm)) return;
      GV.ImmediatSize = 32;
      pMyDisasm->Operand1.OpSize = 32;
      pMyDisasm->Operand2.OpSize = 32;
      MyNumber = *((UInt32*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X",(Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0+8]);
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
        #endif
      }
      GV.EIP_+= 5;
    }
    else {
      if (!Security(3, pMyDisasm)) return;
      GV.ImmediatSize = 16;
      pMyDisasm->Operand1.OpSize = 16;
      pMyDisasm->Operand2.OpSize = 16;
      MyNumber = *((UInt16*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X", (Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0+8]);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
          #endif
      }
      GV.EIP_+= 3;
    }
    if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
      GV.ERROR_OPCODE = UD_;
    }
}